

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarView::mouseReleaseEvent(QCalendarView *this,QMouseEvent *event)

{
  int iVar1;
  QAbstractItemModel *object;
  QCalendarModel *pQVar2;
  QDate _t1;
  QStyle *pQVar3;
  
  object = QAbstractItemView::model((QAbstractItemView *)this);
  pQVar2 = qobject_cast_helper<QtPrivate::QCalendarModel*,QObject>((QObject *)object);
  if (pQVar2 != (QCalendarModel *)0x0) {
    if ((*(int *)(event + 0x40) == 1) && (this->readOnly == false)) {
      if (this->validDateClicked == true) {
        _t1 = handleMouseEvent(this,event);
        if (_t1.jd + 0xb69eeff91fU < 0x16d3e147974) {
          changeDate(this,_t1,true);
          clicked(this,_t1);
          pQVar3 = QWidget::style((QWidget *)this);
          iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x3d,0,this,0);
          if (iVar1 != 0) {
            editingFinished(this);
          }
        }
        this->validDateClicked = false;
      }
      else {
        event[0xc] = (QMouseEvent)0x0;
      }
    }
    return;
  }
  QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,event);
  return;
}

Assistant:

void QCalendarView::mouseReleaseEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseReleaseEvent(event);
        return;
    }

    if (event->button() != Qt::LeftButton)
        return;

    if (readOnly)
        return;

    if (validDateClicked) {
        QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            emit changeDate(date, true);
            emit clicked(date);
            if (style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
                emit editingFinished();
        }
        validDateClicked = false;
    } else {
        event->ignore();
    }
}